

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O0

Move * puppup::movegen::toString_abi_cxx11_(Move *mov,Gaddag *param_2,Gaddag *param_3)

{
  pointer pvVar1;
  long lVar2;
  bool bVar3;
  vector<long,_std::allocator<long>_> *this;
  size_type sVar4;
  ostream *poVar5;
  reference plVar6;
  reference pvVar7;
  chr c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<long,_std::allocator<long>_> *__range2;
  idx y;
  idx x;
  idx cursor;
  vector<long,_std::allocator<long>_> *s;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  Gaddag *local_20;
  Gaddag *gaddag_local;
  Move *mov_local;
  
  local_20 = param_3;
  gaddag_local = param_2;
  mov_local = mov;
  std::__cxx11::stringstream::stringstream(local_1a8);
  makeMove((State *)&stack0x00000008,(Move *)gaddag_local,local_20);
  this = trie::Gaddag::getStringFromWord
                   (local_20,(idx)(gaddag_local->words_).
                                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
  pvVar1 = (gaddag_local->words_).
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  sVar4 = std::vector<long,_std::allocator<long>_>::size(this);
  x = (long)pvVar1 -
      sVar4 * (long)(gaddag_local->nodes_).
                    super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  if ((gaddag_local->nodes_).
      super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x10) {
    poVar5 = (ostream *)std::ostream::operator<<(local_198,x % 0x10 + 1);
    poVar5 = std::operator<<(poVar5,"ABCDEFGHIJKLMNOPQRSTUVWXYZ"[x / 0x10]);
    std::operator<<(poVar5," ");
  }
  else {
    poVar5 = std::operator<<(local_198,"ABCDEFGHIJKLMNOPQRSTUVWXYZ"[x / 0x10]);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,x % 0x10 + 1);
    std::operator<<(poVar5," ");
  }
  __end2 = std::vector<long,_std::allocator<long>_>::begin(this);
  c = (chr)std::vector<long,_std::allocator<long>_>::end(this);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)&c);
    if (!bVar3) break;
    plVar6 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&__end2);
    lVar2 = *plVar6;
    pvVar7 = std::array<long,_256UL>::operator[]((array<long,_256UL> *)&stack0x00000810,x);
    if (*pvVar7 == 0) {
      std::operator<<(local_198,"EIAONTRSULDGYWVPMHFCBZXQKJ_    +"[lVar2]);
    }
    else {
      std::operator<<(local_198,"eiaontrsuldgywvpmhfcbzxqkj_    +"[lVar2]);
    }
    x = (long)(((gaddag_local->nodes_).
                super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                ._M_impl.super__Vector_impl_data._M_start)->children)._M_elems + x;
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
    operator++(&__end2);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return mov;
}

Assistant:

inline std::string toString(const Move& mov, board::State state,
                            const trie::Gaddag& gaddag) {
    std::stringstream ss;
    makeMove(state, mov, gaddag);
    const auto& s = gaddag.getStringFromWord(mov.word);
    idx cursor = mov.cursor - s.size() * mov.step;
    idx x = cursor % 16 - board::board_min;
    idx y = cursor / 16 - board::board_min;
    if (mov.step == 16) {
        ss << x + 1 << ABC[y] << " ";
    } else {
        ss << ABC[y] << x + 1 << " ";
    }

    for (chr c : s) {
        if (state.letter_score[cursor] == 0) {
            ss << idxSTR[c];
        } else {
            ss << idxstr[c];
        }
        cursor += mov.step;
    }
    return ss.str();
}